

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void __thiscall pbrt::StatsAccumulator::StatsAccumulator(StatsAccumulator *this)

{
  Stats *this_00;
  
  this->stats = (Stats *)0x0;
  this_00 = (Stats *)operator_new(0x2c8);
  Stats::Stats(this_00);
  this->stats = this_00;
  return;
}

Assistant:

StatsAccumulator::StatsAccumulator() {
    stats = new Stats;
}